

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_contentTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  uint uVar8;
  ATTRIBUTE *pAVar10;
  uint *puVar11;
  long lVar12;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  char *extraout_RDX_15;
  char *extraout_RDX_16;
  char *extraout_RDX_17;
  char *extraout_RDX_18;
  char *extraout_RDX_19;
  char *extraout_RDX_20;
  char *extraout_RDX_21;
  char *extraout_RDX_22;
  char *extraout_RDX_23;
  char *extraout_RDX_24;
  char *extraout_RDX_25;
  char *pcVar13;
  int iVar14;
  byte *pbVar15;
  byte *pbVar16;
  byte *pbVar17;
  char **ppcStack_70;
  byte *local_60;
  int local_54;
  long local_50;
  byte *local_48;
  char *local_40;
  char *local_38;
  uint uVar9;
  
  if (end <= ptr) {
    return -4;
  }
  pcVar6 = end;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 0:
  case 1:
  case 8:
    break;
  case 2:
    pbVar15 = (byte *)(ptr + 1);
    uVar7 = (long)end - (long)pbVar15;
    if ((long)uVar7 < 1) {
      return -1;
    }
    ppcStack_70 = (char **)&DAT_00000001;
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar15)) {
    case 5:
      if (uVar7 == 1) {
        return -2;
      }
      iVar4 = (*enc[3].nameLength)(enc,(char *)pbVar15);
      if ((iVar4 == 0) &&
         (iVar4 = (*enc[3].literalScanners[0])(enc,(char *)pbVar15,extraout_RDX_09,ppcStack_70),
         iVar4 != 0)) {
        ppcStack_70 = (char **)0x2;
        goto switchD_004e3f3f_caseD_16;
      }
      break;
    case 6:
      if (uVar7 < 3) {
        return -2;
      }
      pcVar6 = (*enc[3].skipS)(enc,(char *)pbVar15);
      if (((int)pcVar6 == 0) &&
         (iVar4 = (*enc[3].literalScanners[1])(enc,(char *)pbVar15,extraout_RDX_10,ppcStack_70),
         iVar4 != 0)) {
        ppcStack_70 = (char **)0x3;
        goto switchD_004e3f3f_caseD_16;
      }
      break;
    case 7:
      if (uVar7 < 4) {
        return -2;
      }
      iVar4 = (*enc[3].getAtts)(enc,(char *)pbVar15,0x674fcc,(ATTRIBUTE *)&DAT_00000001);
      if ((iVar4 == 0) &&
         (iVar4 = (*enc[3].nameMatchesAscii)
                            (enc,(char *)pbVar15,extraout_RDX_11,(char *)ppcStack_70), iVar4 != 0))
      {
        ppcStack_70 = (char **)0x4;
        goto switchD_004e3f3f_caseD_16;
      }
      break;
    case 0xf:
      iVar4 = normal_scanPi(enc,ptr + 2,end,nextTokPtr);
      return iVar4;
    case 0x10:
      pbVar17 = (byte *)(ptr + 2);
      if ((byte *)end == pbVar17 || (long)end - (long)pbVar17 < 0) {
        return -1;
      }
      cVar2 = *(char *)((long)enc[1].scanners + (ulong)*pbVar17);
      if (cVar2 == '\x14') {
        pcVar6 = ptr + 3;
        if ((long)end - (long)pcVar6 < 6) {
          return -1;
        }
        pcVar13 = ptr + 9;
        lVar12 = 0;
        iVar4 = 8;
        do {
          if (lVar12 == 6) {
LAB_004e44f0:
            *nextTokPtr = pcVar13;
            return iVar4;
          }
          if (pcVar6[lVar12] != (&big2_scanCdataSection_CDATA_LSQB)[lVar12]) {
            pcVar13 = pcVar6 + lVar12;
            iVar4 = 0;
            goto LAB_004e44f0;
          }
          lVar12 = lVar12 + 1;
        } while( true );
      }
      if (cVar2 == '\x1b') {
        iVar4 = normal_scanComment(enc,ptr + 3,end,nextTokPtr);
        return iVar4;
      }
      goto LAB_004e4387;
    case 0x11:
      pbVar15 = (byte *)(ptr + 2);
      uVar7 = (long)end - (long)pbVar15;
      if ((long)uVar7 < 1) {
        return -1;
      }
      bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar15);
      pAVar10 = (ATTRIBUTE *)(ulong)bVar1;
      iVar14 = 0;
      iVar4 = 0;
      ppcStack_70 = (char **)0x1;
      if (bVar1 != 0x18) {
        if (bVar1 == 6) {
          if (uVar7 < 3) {
            return -2;
          }
          pcVar6 = (*enc[3].skipS)(enc,(char *)pbVar15);
          if ((int)pcVar6 != 0) goto LAB_004e4a7c;
          iVar5 = (*enc[3].literalScanners[1])(enc,(char *)pbVar15,extraout_RDX_12,&pAVar10->name);
          ppcStack_70 = (char **)0x3;
        }
        else if (bVar1 == 7) {
          if (uVar7 < 4) {
            return -2;
          }
          iVar5 = (*enc[3].getAtts)(enc,(char *)pbVar15,1,pAVar10);
          if (iVar5 != 0) goto LAB_004e4a7c;
          iVar5 = (*enc[3].nameMatchesAscii)(enc,(char *)pbVar15,extraout_RDX_13,(char *)pAVar10);
          ppcStack_70 = (char **)0x4;
        }
        else {
          if (bVar1 == 0x16) goto LAB_004e4406;
          iVar4 = iVar14;
          if (bVar1 != 5) goto LAB_004e4a7c;
          if (uVar7 == 1) {
            return -2;
          }
          iVar5 = (*enc[3].nameLength)(enc,(char *)pbVar15);
          if (iVar5 != 0) goto LAB_004e4a7c;
          iVar5 = (*enc[3].literalScanners[0])(enc,(char *)pbVar15,extraout_RDX_08,&pAVar10->name);
          ppcStack_70 = (char **)0x2;
        }
        iVar4 = iVar14;
        if (iVar5 == 0) goto LAB_004e4a7c;
      }
LAB_004e4406:
      pbVar15 = pbVar15 + (long)ppcStack_70;
LAB_004e4410:
      ppcStack_70 = (char **)&DAT_00000001;
      uVar7 = (long)end - (long)pbVar15;
      if ((long)uVar7 < 1) {
        return -1;
      }
      uVar9 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*pbVar15);
      uVar8 = uVar9 - 5;
      if (0x16 < uVar8) goto switchD_004e4444_caseD_8;
      switch(uVar9) {
      case 5:
        if (uVar7 == 1) {
          return -2;
        }
        iVar4 = (*enc[3].nameLength)(enc,(char *)pbVar15);
        if (iVar4 != 0) goto switchD_004e4444_caseD_8;
        iVar4 = (*enc[3].scanners[0])(enc,(char *)pbVar15,extraout_RDX_14,ppcStack_70);
        ppcStack_70 = (char **)0x2;
        break;
      case 6:
        if (uVar7 < 3) {
          return -2;
        }
        pcVar6 = (*enc[3].skipS)(enc,(char *)pbVar15);
        if ((int)pcVar6 != 0) goto switchD_004e4444_caseD_8;
        iVar4 = (*enc[3].scanners[1])(enc,(char *)pbVar15,extraout_RDX_15,ppcStack_70);
        ppcStack_70 = (char **)0x3;
        break;
      case 7:
        if (uVar7 < 4) {
          return -2;
        }
        iVar4 = (*enc[3].getAtts)(enc,(char *)pbVar15,
                                  (&switchD_004e4444::switchdataD_0067501c)[uVar8] + 0x67501c,
                                  (ATTRIBUTE *)&DAT_00000001);
        if (iVar4 != 0) goto switchD_004e4444_caseD_8;
        iVar4 = (*enc[3].scanners[2])(enc,(char *)pbVar15,extraout_RDX_16,ppcStack_70);
        ppcStack_70 = (char **)0x4;
        break;
      default:
        goto switchD_004e4444_caseD_8;
      case 9:
      case 10:
      case 0x15:
        pcVar6 = end + ~(ulong)pbVar15;
        while( true ) {
          pbVar15 = pbVar15 + 1;
          if ((long)pcVar6 < 1) {
            return -1;
          }
          bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar15);
          if ((1 < bVar1 - 9) && (bVar1 != 0x15)) break;
          pcVar6 = pcVar6 + -1;
        }
        if (bVar1 != 0xb) {
switchD_004e4444_caseD_8:
          iVar4 = 0;
          goto LAB_004e4a7c;
        }
switchD_004e4444_caseD_b:
        pbVar15 = pbVar15 + 1;
        iVar4 = 5;
LAB_004e4a7c:
        *nextTokPtr = (char *)pbVar15;
        return iVar4;
      case 0xb:
        goto switchD_004e4444_caseD_b;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        goto switchD_004e4444_caseD_16;
      }
      if (iVar4 == 0) goto switchD_004e4444_caseD_8;
switchD_004e4444_caseD_16:
      pbVar15 = pbVar15 + (long)ppcStack_70;
      goto LAB_004e4410;
    case 0x16:
    case 0x18:
switchD_004e3f3f_caseD_16:
      pbVar15 = pbVar15 + (long)ppcStack_70;
      do {
        uVar7 = (long)end - (long)pbVar15;
        if ((long)uVar7 < 1) {
          return -1;
        }
        uVar9 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*pbVar15);
        uVar8 = uVar9 - 5;
        if (0x18 < uVar8) break;
        ppcStack_70 = (char **)&DAT_00000001;
        switch(uVar9) {
        case 5:
          if (uVar7 == 1) {
            return -2;
          }
          iVar4 = (*enc[3].nameLength)(enc,(char *)pbVar15);
          if (iVar4 != 0) goto switchD_004e3f3f_caseD_8;
          iVar4 = (*enc[3].scanners[0])(enc,(char *)pbVar15,extraout_RDX_02,ppcStack_70);
          ppcStack_70 = (char **)0x2;
          break;
        case 6:
          if (uVar7 < 3) {
            return -2;
          }
          pcVar6 = (*enc[3].skipS)(enc,(char *)pbVar15);
          if ((int)pcVar6 != 0) goto switchD_004e3f3f_caseD_8;
          iVar4 = (*enc[3].scanners[1])(enc,(char *)pbVar15,extraout_RDX_04,ppcStack_70);
          ppcStack_70 = (char **)0x3;
          break;
        case 7:
          if (uVar7 < 4) {
            return -2;
          }
          iVar4 = (*enc[3].getAtts)(enc,(char *)pbVar15,
                                    (&switchD_004e3f7e::switchdataD_00675078)[uVar8] + 0x675078,
                                    (ATTRIBUTE *)&DAT_00000001);
          if (iVar4 != 0) goto switchD_004e3f3f_caseD_8;
          iVar4 = (*enc[3].scanners[2])(enc,(char *)pbVar15,extraout_RDX_03,ppcStack_70);
          ppcStack_70 = (char **)0x4;
          break;
        default:
          goto switchD_004e3f3f_caseD_8;
        case 9:
        case 10:
        case 0x15:
          pcVar6 = end + ~(ulong)pbVar15;
          puVar11 = &switchD_004e431b::switchdataD_006750dc;
          goto LAB_004e42f1;
        case 0xb:
          goto switchD_004e3f7e_caseD_b;
        case 0x11:
          goto switchD_004e3f7e_caseD_11;
        case 0x16:
        case 0x18:
        case 0x19:
        case 0x1a:
        case 0x1b:
          goto switchD_004e3f7e_caseD_16;
        }
        if (iVar4 == 0) break;
switchD_004e3f7e_caseD_16:
        pbVar15 = pbVar15 + (long)ppcStack_70;
      } while( true );
    }
switchD_004e3f3f_caseD_8:
    *nextTokPtr = (char *)pbVar15;
    return 0;
  case 3:
    iVar4 = normal_scanRef(enc,ptr + 1,end,nextTokPtr);
    return iVar4;
  case 4:
    pbVar15 = (byte *)(ptr + 1);
    if ((byte *)end == pbVar15 || (long)end - (long)pbVar15 < 0) {
      return -5;
    }
    if (*pbVar15 == 0x5d) {
      ptr = ptr + 2;
      if (end == ptr || (long)end - (long)ptr < 0) {
        return -5;
      }
      if (*ptr == 0x3e) break;
    }
    goto LAB_004e402c;
  case 5:
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    iVar4 = (*enc[3].nameLength)(enc,ptr);
    if (iVar4 == 0) {
      pbVar15 = (byte *)(ptr + 2);
      pcVar6 = extraout_RDX_00;
      goto LAB_004e402c;
    }
    break;
  case 6:
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    pcVar6 = (*enc[3].skipS)(enc,ptr);
    if ((int)pcVar6 == 0) {
      pbVar15 = (byte *)(ptr + 3);
      pcVar6 = extraout_RDX;
      goto LAB_004e402c;
    }
    break;
  case 7:
    if ((long)end - (long)ptr < 4) {
      return -2;
    }
    iVar4 = (*enc[3].getAtts)(enc,ptr,(int)end,(ATTRIBUTE *)&switchD_004e3dbd::switchdataD_00674fa0)
    ;
    if (iVar4 == 0) {
      pbVar15 = (byte *)(ptr + 4);
      pcVar6 = extraout_RDX_01;
      goto LAB_004e402c;
    }
    break;
  case 9:
    pcVar6 = ptr + 1;
    if (end != pcVar6 && -1 < (long)end - (long)pcVar6) {
      if (*(char *)((long)enc[1].scanners + (ulong)(byte)ptr[1]) == '\n') {
        pcVar6 = ptr + 2;
      }
      *nextTokPtr = pcVar6;
      return 7;
    }
    return -3;
  case 10:
    *nextTokPtr = ptr + 1;
    return 7;
  default:
    pbVar15 = (byte *)(ptr + 1);
LAB_004e402c:
    pbVar17 = pbVar15;
    pAVar10 = (ATTRIBUTE *)(end + -(long)pbVar17);
    if ((long)pAVar10 < 1) goto switchD_004e405e_caseD_0;
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar17)) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 8:
    case 9:
    case 10:
      break;
    case 4:
      if (pAVar10 == (ATTRIBUTE *)&DAT_00000001) break;
      pbVar15 = pbVar17 + 1;
      if (pbVar17[1] != 0x5d) goto LAB_004e402c;
      if (pAVar10 < (ATTRIBUTE *)0x3) break;
      if (pbVar17[2] == 0x3e) goto LAB_004e429f;
      goto LAB_004e402c;
    case 5:
      if ((pAVar10 != (ATTRIBUTE *)&DAT_00000001) &&
         (iVar4 = (*enc[3].nameLength)(enc,(char *)pbVar17), iVar4 == 0)) {
        pbVar15 = pbVar17 + 2;
        pcVar6 = extraout_RDX_06;
        goto LAB_004e402c;
      }
      break;
    case 6:
      if (((ATTRIBUTE *)0x2 < pAVar10) &&
         (pcVar6 = (*enc[3].skipS)(enc,(char *)pbVar17), (int)pcVar6 == 0)) {
        pbVar15 = pbVar17 + 3;
        pcVar6 = extraout_RDX_05;
        goto LAB_004e402c;
      }
      break;
    case 7:
      if (((ATTRIBUTE *)0x3 < pAVar10) &&
         (iVar4 = (*enc[3].getAtts)(enc,(char *)pbVar17,(int)pcVar6,pAVar10), iVar4 == 0)) {
        pbVar15 = pbVar17 + 4;
        pcVar6 = extraout_RDX_07;
        goto LAB_004e402c;
      }
      break;
    default:
      pbVar15 = pbVar17 + 1;
      goto LAB_004e402c;
    }
switchD_004e405e_caseD_0:
    *nextTokPtr = (char *)pbVar17;
    return 6;
  }
switchD_004e3dbd_caseD_0:
  *nextTokPtr = ptr;
  return 0;
LAB_004e429f:
  ptr = (char *)(pbVar17 + 2);
  goto switchD_004e3dbd_caseD_0;
LAB_004e42f1:
  pbVar15 = pbVar15 + 1;
  if ((long)pcVar6 < 1) {
    return -1;
  }
  uVar9 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*pbVar15);
  uVar8 = uVar9 - 5;
  if (0x18 < uVar8) goto switchD_004e3f3f_caseD_8;
  switch(uVar9) {
  case 5:
    if (pcVar6 == &DAT_00000001) {
      return -2;
    }
    iVar4 = (*enc[3].nameLength)(enc,(char *)pbVar15);
    if ((iVar4 != 0) ||
       (iVar4 = (*enc[3].literalScanners[0])(enc,(char *)pbVar15,extraout_RDX_24,(char **)puVar11),
       iVar4 == 0)) goto switchD_004e3f3f_caseD_8;
    ppcStack_70 = (char **)0x3;
    break;
  case 6:
    if (pcVar6 < (char *)0x3) {
      return -2;
    }
    pcVar6 = (*enc[3].skipS)(enc,(char *)pbVar15);
    if (((int)pcVar6 != 0) ||
       (iVar4 = (*enc[3].literalScanners[1])(enc,(char *)pbVar15,extraout_RDX_23,(char **)puVar11),
       iVar4 == 0)) goto switchD_004e3f3f_caseD_8;
    ppcStack_70 = (char **)0x4;
    break;
  case 7:
    if (pcVar6 < (char *)0x4) {
      return -2;
    }
    iVar4 = (*enc[3].getAtts)(enc,(char *)pbVar15,
                              (&switchD_004e431b::switchdataD_006750dc)[uVar8] + 0x6750dc,
                              (ATTRIBUTE *)&switchD_004e431b::switchdataD_006750dc);
    if ((iVar4 != 0) ||
       (iVar4 = (*enc[3].nameMatchesAscii)(enc,(char *)pbVar15,extraout_RDX_25,(char *)puVar11),
       iVar4 == 0)) goto switchD_004e3f3f_caseD_8;
    ppcStack_70 = (char **)0x5;
    break;
  default:
    goto switchD_004e3f3f_caseD_8;
  case 9:
  case 10:
  case 0x15:
    goto switchD_004e431b_caseD_9;
  case 0xb:
    goto switchD_004e3f7e_caseD_b;
  case 0x11:
    goto switchD_004e3f7e_caseD_11;
  case 0x16:
  case 0x18:
    ppcStack_70 = (char **)0x2;
  }
  local_60 = pbVar15 + (long)ppcStack_70 + -1;
  local_40 = end + -1;
  local_38 = end + -2;
  goto LAB_004e4526;
switchD_004e431b_caseD_9:
  pcVar6 = pcVar6 + -1;
  goto LAB_004e42f1;
LAB_004e4526:
  pbVar15 = local_60;
  uVar7 = (long)end - (long)local_60;
  if ((long)uVar7 < 1) {
    return -1;
  }
  uVar9 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*local_60);
  uVar8 = uVar9 - 5;
  if (0x16 < uVar8) {
switchD_004e4556_caseD_8:
    local_54 = 0;
    goto switchD_004e4727_caseD_0;
  }
  pAVar10 = (ATTRIBUTE *)
            ((long)&switchD_004e4556::switchdataD_00675140 +
            (long)(int)(&switchD_004e4556::switchdataD_00675140)[uVar8]);
  switch(uVar9) {
  case 5:
    local_54 = 0;
    if (uVar7 == 1) {
      return -2;
    }
    iVar4 = (*enc[3].nameLength)(enc,(char *)local_60);
    if ((iVar4 == 0) &&
       (iVar4 = (*enc[3].scanners[0])(enc,(char *)pbVar15,extraout_RDX_19,&pAVar10->name),
       iVar4 != 0)) {
      local_60 = pbVar15 + 2;
      goto LAB_004e4526;
    }
    break;
  case 6:
    local_54 = 0;
    if (uVar7 < 3) {
      return -2;
    }
    pcVar6 = (*enc[3].skipS)(enc,(char *)local_60);
    if (((int)pcVar6 == 0) &&
       (iVar4 = (*enc[3].scanners[1])(enc,(char *)pbVar15,extraout_RDX_18,&pAVar10->name),
       iVar4 != 0)) {
      local_60 = pbVar15 + 3;
      goto LAB_004e4526;
    }
    break;
  case 7:
    local_54 = 0;
    if (uVar7 < 4) {
      return -2;
    }
    iVar4 = (*enc[3].getAtts)(enc,(char *)local_60,0x675140,pAVar10);
    if ((iVar4 == 0) &&
       (iVar4 = (*enc[3].scanners[2])(enc,(char *)pbVar15,extraout_RDX_17,&pAVar10->name),
       iVar4 != 0)) {
      local_60 = pbVar15 + 4;
      goto LAB_004e4526;
    }
    break;
  default:
    goto switchD_004e4556_caseD_8;
  case 9:
  case 10:
  case 0x15:
    local_54 = 0;
    lVar12 = (long)local_40 - (long)local_60;
    while( true ) {
      pbVar15 = pbVar15 + 1;
      if (lVar12 < 1) {
        return -1;
      }
      bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar15);
      if ((1 < bVar1 - 9) && (bVar1 != 0x15)) break;
      lVar12 = lVar12 + -1;
    }
    if (bVar1 == 0xe) goto LAB_004e4696;
    break;
  case 0xe:
LAB_004e4696:
    local_54 = 0;
    lVar12 = (long)local_40 - (long)pbVar15;
    do {
      pbVar15 = pbVar15 + 1;
      if (lVar12 < 1) {
        return -1;
      }
      bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar15);
      local_60 = pbVar15;
      if ((bVar1 & 0xfe) == 0xc) {
switchD_004e4727_caseD_4:
        do {
          local_60 = local_60 + 1;
          while( true ) {
            pbVar15 = local_60;
            uVar7 = (long)end - (long)local_60;
            if ((long)uVar7 < 1) {
              return -1;
            }
            bVar3 = *(byte *)((long)enc[1].scanners + (ulong)*local_60);
            if (bVar3 == bVar1) {
              pbVar17 = local_60 + 1;
              if ((byte *)end == pbVar17 || (long)end - (long)pbVar17 < 0) {
                return -1;
              }
              bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar17);
              if ((bVar1 - 9 < 2) || (bVar1 == 0x15)) {
                pAVar10 = (ATTRIBUTE *)(local_38 + -(long)local_60);
                local_50 = 0;
                pbVar16 = pbVar17;
                goto LAB_004e4810;
              }
              if (bVar1 == 0xb) goto LAB_004e4afa;
              if (bVar1 == 0x11) goto LAB_004e4aad;
              goto LAB_004e4b08;
            }
            uVar8 = (uint)bVar3;
            if (8 < uVar8) break;
            switch(uVar8) {
            default:
              goto switchD_004e4727_caseD_0;
            case 3:
              iVar4 = normal_scanRef(enc,(char *)(local_60 + 1),end,(char **)&local_60);
              if (iVar4 < 1) {
                pbVar17 = local_60;
                if (iVar4 != 0) {
                  return iVar4;
                }
                goto LAB_004e4b08;
              }
              break;
            case 4:
              goto switchD_004e4727_caseD_4;
            case 5:
              if (uVar7 == 1) {
                return -2;
              }
              iVar4 = (*enc[3].nameLength)(enc,(char *)local_60);
              if (iVar4 != 0) goto switchD_004e4727_caseD_0;
              local_60 = pbVar15 + 2;
              break;
            case 6:
              if (uVar7 < 3) {
                return -2;
              }
              pcVar6 = (*enc[3].skipS)(enc,(char *)local_60);
              if ((int)pcVar6 != 0) goto switchD_004e4727_caseD_0;
              local_60 = pbVar15 + 3;
              break;
            case 7:
              if (uVar7 < 4) {
                return -2;
              }
              iVar4 = (*enc[3].getAtts)(enc,(char *)local_60,0x67519c,
                                        (ATTRIBUTE *)
                                        ((long)&switchD_004e4727::switchdataD_0067519c +
                                        (long)(int)(&switchD_004e4727::switchdataD_0067519c)[uVar8])
                                       );
              if (iVar4 != 0) goto switchD_004e4727_caseD_0;
              local_60 = pbVar15 + 4;
            }
          }
        } while( true );
      }
      if ((0x15 < bVar1) || ((0x200600U >> (bVar1 & 0x1f) & 1) == 0)) break;
      lVar12 = lVar12 + -1;
    } while( true );
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
    goto switchD_004e4556_caseD_16;
  }
switchD_004e4727_caseD_0:
  pbVar17 = pbVar15;
  goto LAB_004e4b08;
switchD_004e4556_caseD_16:
  local_60 = local_60 + 1;
  goto LAB_004e4526;
LAB_004e4810:
  if ((long)pAVar10 < 1) {
    return -1;
  }
  uVar9 = (uint)*(byte *)((long)enc[1].scanners + (ulong)local_60[local_50 + 2]);
  uVar8 = uVar9 - 5;
  if (0x13 < uVar8) {
switchD_004e484a_caseD_8:
    pbVar17 = local_60 + local_50 + 2;
    goto LAB_004e4b08;
  }
  pbVar16 = pbVar16 + 1;
  switch(uVar9) {
  case 5:
    goto switchD_004e484a_caseD_5;
  case 6:
    if (pAVar10 < (ATTRIBUTE *)0x3) {
      return -2;
    }
    local_48 = local_60 + local_50 + 2;
    local_60 = pbVar17;
    pcVar6 = (*enc[3].skipS)(enc,(char *)local_48);
    pbVar17 = pbVar16;
    if (((int)pcVar6 != 0) ||
       (iVar4 = (*enc[3].literalScanners[1])(enc,(char *)local_48,extraout_RDX_20,&pAVar10->name),
       iVar4 == 0)) goto LAB_004e4b08;
    local_60 = pbVar15 + local_50 + 5;
    goto LAB_004e4526;
  case 7:
    if (pAVar10 < (ATTRIBUTE *)0x4) {
      return -2;
    }
    local_48 = local_60 + local_50 + 2;
    local_60 = pbVar17;
    iVar4 = (*enc[3].getAtts)(enc,(char *)local_48,
                              (&switchD_004e484a::switchdataD_006751c0)[uVar8] + 0x6751c0,pAVar10);
    pbVar17 = local_48;
    if ((iVar4 != 0) ||
       (iVar4 = (*enc[3].nameMatchesAscii)(enc,(char *)local_48,extraout_RDX_22,(char *)pAVar10),
       pbVar17 = pbVar16, iVar4 == 0)) goto LAB_004e4b08;
    local_60 = pbVar15 + local_50 + 6;
    goto LAB_004e4526;
  default:
    goto switchD_004e484a_caseD_8;
  case 9:
  case 10:
  case 0x15:
    break;
  case 0xb:
    local_60 = local_60 + local_50 + 1;
LAB_004e4afa:
    pbVar15 = local_60 + 2;
    local_54 = 1;
    goto switchD_004e4727_caseD_0;
  case 0x11:
    pbVar17 = local_60 + local_50 + 2;
LAB_004e4aad:
    pbVar15 = pbVar17 + 1;
    if ((byte *)end == pbVar15 || (long)end - (long)pbVar15 < 0) {
      return -1;
    }
    if (pbVar17[1] == 0x3e) {
      pbVar15 = pbVar17 + 2;
    }
    local_54 = (uint)(pbVar17[1] == 0x3e) * 3;
    pbVar17 = pbVar15;
    goto LAB_004e4b08;
  case 0x16:
  case 0x18:
    local_60 = local_60 + local_50 + 3;
    goto LAB_004e4526;
  }
  local_50 = local_50 + 1;
  pAVar10 = (ATTRIBUTE *)&pAVar10[-1].field_0x1f;
  goto LAB_004e4810;
switchD_004e484a_caseD_5:
  if (uVar7 - 3 == local_50) {
    return -2;
  }
  local_48 = local_60 + local_50 + 2;
  local_60 = pbVar17;
  iVar4 = (*enc[3].nameLength)(enc,(char *)local_48);
  pbVar17 = pbVar16;
  if ((iVar4 != 0) ||
     (iVar4 = (*enc[3].literalScanners[0])(enc,(char *)local_48,extraout_RDX_21,&pAVar10->name),
     iVar4 == 0)) {
LAB_004e4b08:
    *nextTokPtr = (char *)pbVar17;
    return local_54;
  }
  local_60 = pbVar15 + local_50 + 4;
  goto LAB_004e4526;
switchD_004e3f7e_caseD_b:
  *nextTokPtr = (char *)(pbVar15 + 1);
  return 2;
switchD_004e3f7e_caseD_11:
  pbVar17 = pbVar15 + 1;
  if ((byte *)end == pbVar17 || (long)end - (long)pbVar17 < 0) {
    return -1;
  }
  if (*pbVar17 == 0x3e) {
    *nextTokPtr = (char *)(pbVar15 + 2);
    return 4;
  }
LAB_004e4387:
  *nextTokPtr = (char *)pbVar17;
  return 0;
}

Assistant:

static int PTRCALL
PREFIX(contentTok)(const ENCODING *enc, const char *ptr, const char *end,
                   const char **nextTokPtr) {
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_LT:
    return PREFIX(scanLt)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_AMP:
    return PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_CR:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_CR;
    if (BYTE_TYPE(enc, ptr) == BT_LF)
      ptr += MINBPC(enc);
    *nextTokPtr = ptr;
    return XML_TOK_DATA_NEWLINE;
  case BT_LF:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DATA_NEWLINE;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_RSQB;
    if (! CHAR_MATCHES(enc, ptr, ASCII_RSQB))
      break;
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_RSQB;
    if (! CHAR_MATCHES(enc, ptr, ASCII_GT)) {
      ptr -= MINBPC(enc);
      break;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
    INVALID_CASES(ptr, nextTokPtr)
  default:
    ptr += MINBPC(enc);
    break;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n:                                                             \
    if (end - ptr < n || IS_INVALID_CHAR(enc, ptr, n)) {                       \
      *nextTokPtr = ptr;                                                       \
      return XML_TOK_DATA_CHARS;                                               \
    }                                                                          \
    ptr += n;                                                                  \
    break;
      LEAD_CASE(2)
      LEAD_CASE(3)
      LEAD_CASE(4)
#  undef LEAD_CASE
    case BT_RSQB:
      if (HAS_CHARS(enc, ptr, end, 2)) {
        if (! CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_RSQB)) {
          ptr += MINBPC(enc);
          break;
        }
        if (HAS_CHARS(enc, ptr, end, 3)) {
          if (! CHAR_MATCHES(enc, ptr + 2 * MINBPC(enc), ASCII_GT)) {
            ptr += MINBPC(enc);
            break;
          }
          *nextTokPtr = ptr + 2 * MINBPC(enc);
          return XML_TOK_INVALID;
        }
      }
      /* fall through */
    case BT_AMP:
    case BT_LT:
    case BT_NONXML:
    case BT_MALFORM:
    case BT_TRAIL:
    case BT_CR:
    case BT_LF:
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}